

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

void __thiscall
RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::populate(RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this)

{
  pointer pwVar1;
  pointer pbVar2;
  iterator __position;
  uint uVar3;
  result_type rVar4;
  ulong uVar5;
  size_t __i;
  long lVar6;
  size_t length;
  size_type __pos;
  size_t sVar7;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  mt19937 randgen;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1418;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_13f8;
  vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *local_13f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_13e8;
  param_type local_13c8;
  param_type local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13f0 = (vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
               &this->m_tokens;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_13f0,
                    (this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->m_str)._M_string_length = 0;
  *(this->m_str)._M_dataplus._M_p = L'\0';
  uVar3 = std::chrono::_V2::system_clock::now();
  local_13b8._M_x[0] = (unsigned_long)uVar3;
  lVar6 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar6);
    local_13b8._M_x[lVar6] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13b8._M_p = 0x270;
  local_13c0._M_a = 5;
  local_13c0._M_b = 0x40;
  local_13c8._M_a = 0;
  local_13c8._M_b = 0x10;
  sVar7 = this->m_fixed_word_count;
  if (sVar7 == 0) {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13c0,&local_13b8,&local_13c0
                      );
    sVar7 = (size_t)rVar4;
  }
  if ((ulong)((long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < sVar7) {
    local_13f8 = &this->m_token_indexes;
    do {
      length = this->m_fixed_word_length;
      if (length == 0) {
        rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_13c8,&local_13b8,
                           &local_13c8);
        length = (size_t)rVar4;
      }
      local_1418._M_dataplus._M_p = (pointer)&local_1418.field_2;
      pwVar1 = (this->m_delim)._M_dataplus._M_p;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_1418,pwVar1,pwVar1 + (this->m_delim)._M_string_length);
      make_word<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
                (&local_13e8,&local_1418,length);
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>(local_13f0,&local_13e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
        operator_delete(local_13e8._M_dataplus._M_p,local_13e8.field_2._M_allocated_capacity * 4 + 4
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
        operator_delete(local_1418._M_dataplus._M_p,local_1418.field_2._M_allocated_capacity * 4 + 4
                       );
      }
      pbVar2 = (this->m_tokens).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar2[-1]._M_string_length == 0) {
        (this->m_tokens).
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
        pwVar1 = pbVar2[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)pwVar1 != &pbVar2[-1].field_2) {
          operator_delete(pwVar1,pbVar2[-1].field_2._M_allocated_capacity * 4 + 4);
        }
      }
      else {
        local_13e8._M_dataplus._M_p = (pointer)(this->m_str)._M_string_length;
        __position._M_current =
             (this->m_token_indexes).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_token_indexes).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(local_13f8,__position,(unsigned_long *)&local_13e8);
        }
        else {
          *__position._M_current = (unsigned_long)local_13e8._M_dataplus._M_p;
          (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pbVar2 = (this->m_tokens).
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
        replace(&this->m_str,(this->m_str)._M_string_length,0,pbVar2[-1]._M_dataplus._M_p,
                pbVar2[-1]._M_string_length);
      }
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      replace(&this->m_str,(this->m_str)._M_string_length,0,(this->m_delim)._M_dataplus._M_p,
              (this->m_delim)._M_string_length);
    } while ((ulong)((long)(this->m_tokens).
                           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_tokens).
                           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) < sVar7);
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(m_delim, word_length));
			if (m_tokens.back().empty()) {
				m_tokens.pop_back();
			}
			else {
				m_token_indexes.push_back(m_str.size());
				m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			}
			m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
		}
	}